

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O3

void Sim_SymmsBalanceCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  size_t __size;
  uint uVar1;
  void **ppvVar2;
  long lVar3;
  int iVar4;
  
  do {
    if (((ulong)pNode & 1) != 0) {
      iVar4 = vNodes->nSize;
      if (0 < (long)iVar4) {
        lVar3 = 0;
        do {
          if ((Abc_Obj_t *)vNodes->pArray[lVar3] == pNode) {
            return;
          }
          lVar3 = lVar3 + 1;
        } while (iVar4 != lVar3);
      }
LAB_004d6033:
      if (iVar4 == vNodes->nCap) {
        if (iVar4 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar2;
          vNodes->nCap = 0x10;
        }
        else {
          __size = (ulong)(uint)(iVar4 * 2) * 8;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(__size);
          }
          else {
            ppvVar2 = (void **)realloc(vNodes->pArray,__size);
          }
          vNodes->pArray = ppvVar2;
          vNodes->nCap = iVar4 * 2;
        }
      }
      else {
        ppvVar2 = vNodes->pArray;
      }
      iVar4 = vNodes->nSize;
      vNodes->nSize = iVar4 + 1;
      ppvVar2[iVar4] = pNode;
      return;
    }
    uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar1 == 5) || (uVar1 == 2)) {
      iVar4 = vNodes->nSize;
      if (0 < (long)iVar4) {
        lVar3 = 0;
        do {
          if ((Abc_Obj_t *)vNodes->pArray[lVar3] == pNode) {
            return;
          }
          lVar3 = lVar3 + 1;
        } while (iVar4 != lVar3);
      }
      goto LAB_004d6033;
    }
    Sim_SymmsBalanceCollect_rec
              ((Abc_Obj_t *)
               ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
               (ulong)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]),vNodes);
    pNode = (Abc_Obj_t *)
            ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
            (ulong)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
  } while( true );
}

Assistant:

void Sim_SymmsBalanceCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    // if the new node is complemented, another gate begins
    if ( Abc_ObjIsComplement(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;
    }
    // if pNew is the PI node, return
    if ( Abc_ObjIsCi(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;    
    }
    // go through the branches
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild0(pNode), vNodes );
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild1(pNode), vNodes );
}